

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ImageT<unsigned_char,_3U>::resample
          (ImageT<unsigned_char,_3U> *this,uint32_t targetWidth,uint32_t targetHeight,char *filter,
          float filterScale,Boundary_Op wrapMode)

{
  _func_int *p_Var1;
  uint uVar2;
  uint uVar3;
  _func_int **pp_Var4;
  char cVar5;
  undefined1 uVar6;
  int iVar7;
  float *pfVar8;
  runtime_error *this_00;
  uint32_t c_1;
  long lVar9;
  long lVar10;
  int iVar11;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  uint32_t c;
  unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *this_01;
  vector<float,_std::allocator<float>_> *pvVar12;
  uint32_t sourceX;
  ulong uVar13;
  ulong uVar14;
  TransferFunctionLinear *pTVar15;
  float fVar16;
  float extraout_XMM0_Da;
  format_args args;
  string_view fmt;
  uint32_t sourceWidth;
  uint32_t targetWidth_local;
  _func_int **local_108;
  uint32_t sourceHeight;
  uint32_t targetHeight_local;
  char *filter_local;
  undefined4 local_f0;
  float local_ec;
  undefined8 local_e8;
  Boundary_Op wrapMode_local;
  float filterScale_local;
  long local_d8;
  ulong local_d0;
  TransferFunctionLinear tfLinear;
  TransferFunctionSRGB tfSRGB;
  array<const_float_*,_3UL> outputLine;
  array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL> resamplers
  ;
  array<std::vector<float,_std::allocator<float>_>,_3UL> samples;
  
  filter_local = (char *)CONCAT44(in_register_00000084,wrapMode);
  lVar9 = CONCAT44(in_register_00000034,targetWidth);
  targetHeight_local = (uint32_t)filter;
  wrapMode_local = in_R9._0_4_;
  targetWidth_local = targetHeight;
  filterScale_local = filterScale;
  std::make_unique<ImageT<unsigned_char,3u>,unsigned_int&,unsigned_int&>
            ((uint *)&local_108,&targetWidth_local);
  local_108[2] = *(_func_int **)(lVar9 + 0x10);
  sourceWidth = *(uint *)(lVar9 + 8);
  sourceHeight = *(uint *)(lVar9 + 0xc);
  local_d8 = lVar9;
  if ((sourceWidth != 0) && (sourceHeight != 0)) {
    if ((targetWidth_local != 0) && (targetHeight_local != 0)) {
      uVar2 = sourceHeight;
      if (sourceHeight < sourceWidth) {
        uVar2 = sourceWidth;
      }
      uVar3 = targetHeight_local;
      if (targetHeight_local < targetWidth_local) {
        uVar3 = targetWidth_local;
      }
      if ((uVar2 < 0x4001) && (uVar3 < 0x4001)) {
        samples._M_elems[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        samples._M_elems[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        samples._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        samples._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        samples._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        samples._M_elems[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_01 = resamplers._M_elems;
        resamplers._M_elems[2]._M_t.
        super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
        super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
             (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>
             )(__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x0;
        resamplers._M_elems[0]._M_t.
        super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
        super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
             (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>
             )(__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x0;
        resamplers._M_elems[1]._M_t.
        super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
        super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
             (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>
             )(__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x0;
        for (lVar9 = 0; lVar9 != 0x48; lVar9 = lVar9 + 0x18) {
          local_e8._4_4_ = 0;
          local_e8._0_4_ = 0x3f800000;
          if (lVar9 == 0) {
            tfSRGB.super_TransferFunction._vptr_TransferFunction =
                 (TransferFunction)(_func_int **)0x0;
            tfLinear.super_TransferFunction._vptr_TransferFunction =
                 (TransferFunction)(_func_int **)0x0;
          }
          else {
            tfSRGB.super_TransferFunction._vptr_TransferFunction =
                 *(TransferFunction *)
                  ((long)resamplers._M_elems[0]._M_t.
                         super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                         .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl + 0x30);
            tfLinear.super_TransferFunction._vptr_TransferFunction =
                 *(TransferFunction *)
                  ((long)resamplers._M_elems[0]._M_t.
                         super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                         .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl + 0x38);
          }
          local_ec = 0.0;
          local_f0 = 0;
          std::
          make_unique<basisu::Resampler,unsigned_int_const&,unsigned_int_const&,unsigned_int&,unsigned_int&,basisu::Resampler::Boundary_Op&,float,float,char_const*&,basisu::Resampler::Contrib_List*,basisu::Resampler::Contrib_List*,float&,float&,float,float>
                    ((uint *)&outputLine,&sourceWidth,&sourceHeight,&targetWidth_local,
                     &targetHeight_local,(float *)&wrapMode_local,(float *)((long)&local_e8 + 4),
                     (char **)&local_e8,(Contrib_List **)&filter_local,(Contrib_List **)&tfSRGB,
                     (float *)&tfLinear,&filterScale_local,&filterScale_local,&local_ec);
          pfVar8 = outputLine._M_elems[0];
          outputLine._M_elems[0] = (float *)0x0;
          std::__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::reset
                    ((__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     this_01,(pointer)pfVar8);
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     &outputLine);
          checkResamplerStatus
                    ((((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                      &this_01->_M_t)->_M_t).
                     super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                     .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl,filter_local);
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)
                     ((long)&samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar9),(ulong)sourceWidth);
          this_01 = this_01 + 1;
        }
        tfSRGB.super_TransferFunction._vptr_TransferFunction =
             (TransferFunction)&PTR_encode_00241940;
        tfLinear.super_TransferFunction._vptr_TransferFunction =
             (TransferFunction)&PTR_encode_00241998;
        pTVar15 = &tfLinear;
        if (*(int *)(local_d8 + 0x10) == 2) {
          pTVar15 = (TransferFunctionLinear *)&tfSRGB;
        }
        iVar11 = 0;
        uVar14 = 0;
        while (pp_Var4 = local_108, (uint)uVar14 < sourceHeight) {
          local_d0 = uVar14;
          for (uVar13 = 0; uVar13 < sourceWidth; uVar13 = uVar13 + 1) {
            iVar7 = sourceWidth * (int)local_d0;
            lVar9 = *(long *)(local_d8 + 0x18);
            pvVar12 = samples._M_elems;
            for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
              fVar16 = (float)(*(code *)((Contrib_List *)
                                        (pTVar15->super_TransferFunction)._vptr_TransferFunction)->p
                              )((float)*(byte *)((ulong)(uint)(iVar7 + (int)uVar13) * 3 + lVar9 +
                                                lVar10) * 0.003921569,pTVar15);
              (((_Vector_base<float,_std::allocator<float>_> *)
               &(pvVar12->super__Vector_base<float,_std::allocator<float>_>)._M_impl)->_M_impl).
              super__Vector_impl_data._M_start[uVar13] = fVar16;
              pvVar12 = pvVar12 + 1;
            }
          }
          for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
            cVar5 = basisu::Resampler::put_line
                              ((float *)resamplers._M_elems[lVar9]._M_t.
                                        super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                        .super__Head_base<0UL,_basisu::Resampler_*,_false>.
                                        _M_head_impl);
            if (cVar5 == '\0') {
              checkResamplerStatus
                        (resamplers._M_elems[lVar9]._M_t.
                         super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                         .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl,
                         filter_local);
            }
          }
          while( true ) {
            outputLine._M_elems[0] = (float *)0x0;
            outputLine._M_elems[1] = (float *)0x0;
            outputLine._M_elems[2] = (float *)0x0;
            for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
              pfVar8 = (float *)basisu::Resampler::get_line();
              outputLine._M_elems[lVar9] = pfVar8;
            }
            if (outputLine._M_elems[0] == (float *)0x0) break;
            for (uVar14 = 0; uVar14 < targetWidth_local; uVar14 = uVar14 + 1) {
              iVar7 = targetWidth_local * iVar11;
              p_Var1 = local_108[3];
              for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                (**(code **)(pTVar15->super_TransferFunction)._vptr_TransferFunction)
                          (outputLine._M_elems[lVar9][uVar14],pTVar15);
                if (0.0 <= extraout_XMM0_Da) {
                  uVar6 = 0xff;
                  if (extraout_XMM0_Da <= 1.0) {
                    uVar6 = (undefined1)(int)(extraout_XMM0_Da * 255.0 + 0.5);
                  }
                }
                else {
                  uVar6 = 0;
                }
                p_Var1[lVar9 + (ulong)(uint)(iVar7 + (int)uVar14) * 3] = (_func_int)uVar6;
              }
            }
            iVar11 = iVar11 + 1;
          }
          uVar14 = (ulong)((int)local_d0 + 1);
        }
        local_108 = (_func_int **)0x0;
        (this->super_Image)._vptr_Image = pp_Var4;
        std::array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_3UL>
        ::~array(&resamplers);
        std::array<std::vector<float,_std::allocator<float>_>,_3UL>::~array(&samples);
        if (local_108 != (_func_int **)0x0) {
          (**(code **)(*local_108 + 8))();
        }
        return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
               (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)this;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      resamplers._M_elems[0]._M_t.
      super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
      super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
      super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
           (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>)
           (__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x4000;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&resamplers;
      fmt.size_ = 1;
      fmt.data_ = (char *)0x2a;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)&samples,(v10 *)"Image larger than max supported size of {}",fmt,args);
      std::runtime_error::runtime_error(this_00,(string *)&samples);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __assert_fail("sourceWidth && sourceHeight && targetWidth && targetHeight",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x461,
                "virtual std::unique_ptr<Image> ImageT<unsigned char, 3>::resample(uint32_t, uint32_t, const char *, float, basisu::Resampler::Boundary_Op) [componentType = unsigned char, componentCount = 3]"
               );
}

Assistant:

virtual std::unique_ptr<Image> resample(uint32_t targetWidth, uint32_t targetHeight,
            const char* filter, float filterScale, basisu::Resampler::Boundary_Op wrapMode) override {
        using namespace basisu;

        auto target = std::make_unique<ImageT<componentType, componentCount>>(targetWidth, targetHeight);
        target->setTransferFunction(transferFunction);
        target->setPrimaries(primaries);

        const auto sourceWidth = width;
        const auto sourceHeight = height;
        assert(sourceWidth && sourceHeight && targetWidth && targetHeight);

        if (std::max(sourceWidth, sourceHeight) > BASISU_RESAMPLER_MAX_DIMENSION ||
                std::max(targetWidth, targetHeight) > BASISU_RESAMPLER_MAX_DIMENSION) {
            throw std::runtime_error(fmt::format(
                    "Image larger than max supported size of {}", BASISU_RESAMPLER_MAX_DIMENSION));
        }

        std::array<std::vector<float>, componentCount> samples;
        std::array<std::unique_ptr<Resampler>, componentCount> resamplers;

        // Float types handled as SFloat HDR otherwise UNROM LDR is assumed
        const auto isHDR = std::is_floating_point_v<componentType>;

        for (uint32_t i = 0; i < componentCount; ++i) {
            resamplers[i] = std::make_unique<Resampler>(
                    sourceWidth, sourceHeight,
                    targetWidth, targetHeight,
                    wrapMode,
                    0.0f, isHDR ? 0.0f : 1.0f,
                    filter,
                    i == 0 ? nullptr : resamplers[0]->get_clist_x(),
                    i == 0 ? nullptr : resamplers[0]->get_clist_y(),
                    filterScale, filterScale,
                    0.f, 0.f);
            checkResamplerStatus(*resamplers[i], filter);
            samples[i].resize(sourceWidth);
        }

        const TransferFunctionSRGB tfSRGB;
        const TransferFunctionLinear tfLinear;
        const TransferFunction& tf = transferFunction == KHR_DF_TRANSFER_SRGB ?
                static_cast<const TransferFunction&>(tfSRGB) :
                static_cast<const TransferFunction&>(tfLinear);

        uint32_t targetY = 0;
        for (uint32_t sourceY = 0; sourceY < sourceHeight; ++sourceY) {
            // Put source lines into resampler(s)
            for (uint32_t sourceX = 0; sourceX < sourceWidth; ++sourceX) {
                const auto& sourcePixel = pixels[sourceY * sourceWidth + sourceX];
                for (uint32_t c = 0; c < componentCount; ++c) {
                    const float value = std::is_floating_point_v<componentType> ?
                            sourcePixel[c] :
                            static_cast<float>(sourcePixel[c]) * (1.f / static_cast<float>(Color::one()));

                    // c == 3: Alpha channel always uses tfLinear
                    samples[c][sourceX] = (c == 3 ? tfLinear : tf).decode(value);
                }
            }

            for (uint32_t c = 0; c < componentCount; ++c)
                if (!resamplers[c]->put_line(&samples[c][0]))
                    checkResamplerStatus(*resamplers[c], filter);

            // Retrieve any output lines
            while (true) {
                std::array<const float*, componentCount> outputLine{nullptr};
                for (uint32_t c = 0; c < componentCount; ++c)
                    outputLine[c] = resamplers[c]->get_line();

                if (outputLine[0] == nullptr)
                    break; // No new output line, break from retrieve and place in a new source line

                for (uint32_t targetX = 0; targetX < targetWidth; ++targetX) {
                    Color& targetPixel = target->pixels[targetY * targetWidth + targetX];
                    for (uint32_t c = 0; c < componentCount; ++c) {
                        const auto linearValue = outputLine[c][targetX];

                        // c == 3: Alpha channel always uses tfLinear
                        const float outValue = (c == 3 ? tfLinear : tf).encode(linearValue);
                        if constexpr (std::is_floating_point_v<componentType>) {
                            targetPixel[c] = outValue;
                        } else {
                            const auto unormValue =
                                std::isnan(outValue) ? componentType{0} :
                                outValue < 0.f ? componentType{0} :
                                outValue > 1.f ? Color::one() :
                                static_cast<componentType>(outValue * static_cast<float>(Color::one()) + 0.5f);
                            targetPixel[c] = unormValue;
                        }
                    }
                }

                ++targetY;
            }
        }

        return target;
    }